

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256_x86_shani.cpp
# Opt level: O3

void sha256d64_x86_shani::Transform_2way(uchar *out,uchar *in)

{
  long lVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  int iVar93;
  int iVar102;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  int iVar103;
  int iVar115;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  int iVar128;
  int iVar133;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  int iVar134;
  int iVar138;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  auVar129 = pshufb(*(undefined1 (*) [16])in,_DAT_001ab840);
  auVar135 = pshufb(*(undefined1 (*) [16])(in + 0x40),_DAT_001ab840);
  auVar147._0_4_ = auVar129._0_4_ + 0x428a2f98;
  auVar147._4_4_ = auVar129._4_4_ + 0x71374491;
  auVar147._8_4_ = auVar129._8_4_ + -0x4a3f0431;
  auVar147._12_4_ = auVar129._12_4_ + -0x164a245b;
  auVar146 = sha256rnds2_sha(_DAT_001ac4e0,_DAT_001ac4d0,auVar147);
  auVar104._4_4_ = auVar147._12_4_;
  auVar104._0_4_ = auVar147._8_4_;
  auVar104._8_4_ = auVar147._0_4_;
  auVar104._12_4_ = auVar147._0_4_;
  auVar152 = sha256rnds2_sha(_DAT_001ac4d0,auVar146,auVar104);
  auVar163._0_4_ = auVar135._0_4_ + 0x428a2f98;
  auVar163._4_4_ = auVar135._4_4_ + 0x71374491;
  auVar163._8_4_ = auVar135._8_4_ + -0x4a3f0431;
  auVar163._12_4_ = auVar135._12_4_ + -0x164a245b;
  auVar157 = sha256rnds2_sha(_DAT_001ac4e0,_DAT_001ac4d0,auVar163);
  auVar153._4_4_ = auVar163._12_4_;
  auVar153._0_4_ = auVar163._8_4_;
  auVar153._8_4_ = auVar163._0_4_;
  auVar153._12_4_ = auVar163._0_4_;
  auVar163 = sha256rnds2_sha(_DAT_001ac4d0,auVar157,auVar153);
  auVar104 = pshufb(*(undefined1 (*) [16])(in + 0x10),_DAT_001ab840);
  auVar174 = pshufb(*(undefined1 (*) [16])(in + 0x50),_DAT_001ab840);
  auVar154._0_4_ = auVar104._0_4_ + 0x3956c25b;
  auVar154._4_4_ = auVar104._4_4_ + 0x59f111f1;
  auVar154._8_4_ = auVar104._8_4_ + -0x6dc07d5c;
  auVar154._12_4_ = auVar104._12_4_ + -0x54e3a12b;
  auVar147 = sha256rnds2_sha(auVar146,auVar152,auVar154);
  auVar146._4_4_ = auVar154._12_4_;
  auVar146._0_4_ = auVar154._8_4_;
  auVar146._8_4_ = auVar154._0_4_;
  auVar146._12_4_ = auVar154._0_4_;
  auVar153 = sha256rnds2_sha(auVar152,auVar147,auVar146);
  auVar152._0_4_ = auVar174._0_4_ + 0x3956c25b;
  auVar152._4_4_ = auVar174._4_4_ + 0x59f111f1;
  auVar152._8_4_ = auVar174._8_4_ + -0x6dc07d5c;
  auVar152._12_4_ = auVar174._12_4_ + -0x54e3a12b;
  auVar146 = sha256rnds2_sha(auVar157,auVar163,auVar152);
  auVar157._4_4_ = auVar152._12_4_;
  auVar157._0_4_ = auVar152._8_4_;
  auVar157._8_4_ = auVar152._0_4_;
  auVar157._12_4_ = auVar152._0_4_;
  auVar157 = sha256rnds2_sha(auVar163,auVar146,auVar157);
  auVar181 = pshufb(*(undefined1 (*) [16])(in + 0x20),_DAT_001ab840);
  auVar158._0_4_ = auVar181._0_4_ + -0x27f85568;
  auVar158._4_4_ = auVar181._4_4_ + 0x12835b01;
  auVar158._8_4_ = auVar181._8_4_ + 0x243185be;
  auVar158._12_4_ = auVar181._12_4_ + 0x550c7dc3;
  auVar163 = sha256rnds2_sha(auVar147,auVar153,auVar158);
  auVar164._4_4_ = auVar158._12_4_;
  auVar164._0_4_ = auVar158._8_4_;
  auVar164._8_4_ = auVar158._0_4_;
  auVar164._12_4_ = auVar158._0_4_;
  auVar154 = sha256rnds2_sha(auVar153,auVar163,auVar164);
  auVar186 = pshufb(*(undefined1 (*) [16])(in + 0x60),_DAT_001ab840);
  auVar170._0_4_ = auVar186._0_4_ + -0x27f85568;
  auVar170._4_4_ = auVar186._4_4_ + 0x12835b01;
  auVar170._8_4_ = auVar186._8_4_ + 0x243185be;
  auVar170._12_4_ = auVar186._12_4_ + 0x550c7dc3;
  auVar152 = sha256rnds2_sha(auVar146,auVar157,auVar170);
  auVar178._4_4_ = auVar170._12_4_;
  auVar178._0_4_ = auVar170._8_4_;
  auVar178._8_4_ = auVar170._0_4_;
  auVar178._12_4_ = auVar170._0_4_;
  auVar157 = sha256rnds2_sha(auVar157,auVar152,auVar178);
  auVar147 = pshufb(*(undefined1 (*) [16])(in + 0x30),_DAT_001ab840);
  auVar146 = pshufb(*(undefined1 (*) [16])(in + 0x70),_DAT_001ab840);
  auVar183._0_4_ = auVar147._0_4_ + 0x72be5d74;
  auVar183._4_4_ = auVar147._4_4_ + -0x7f214e02;
  auVar183._8_4_ = auVar147._8_4_ + -0x6423f959;
  auVar183._12_4_ = auVar147._12_4_ + -0x3e640e8c;
  auVar153 = sha256rnds2_sha(auVar163,auVar154,auVar183);
  auVar188._4_4_ = auVar183._12_4_;
  auVar188._0_4_ = auVar183._8_4_;
  auVar188._8_4_ = auVar183._0_4_;
  auVar188._12_4_ = auVar183._0_4_;
  auVar154 = sha256rnds2_sha(auVar154,auVar153,auVar188);
  auVar116._0_4_ = auVar146._0_4_ + 0x72be5d74;
  auVar116._4_4_ = auVar146._4_4_ + -0x7f214e02;
  auVar116._8_4_ = auVar146._8_4_ + -0x6423f959;
  auVar116._12_4_ = auVar146._12_4_ + -0x3e640e8c;
  auVar158 = sha256rnds2_sha(auVar152,auVar157,auVar116);
  auVar4._4_4_ = auVar116._12_4_;
  auVar4._0_4_ = auVar116._8_4_;
  auVar4._8_4_ = auVar116._0_4_;
  auVar4._12_4_ = auVar116._0_4_;
  auVar164 = sha256rnds2_sha(auVar157,auVar158,auVar4);
  auVar163 = sha256msg1_sha(auVar129,auVar104);
  auVar117._0_4_ = auVar181._4_4_ + auVar163._0_4_;
  auVar117._4_4_ = auVar181._8_4_ + auVar163._4_4_;
  auVar117._8_4_ = auVar181._12_4_ + auVar163._8_4_;
  auVar117._12_4_ = auVar147._0_4_ + auVar163._12_4_;
  auVar163 = sha256msg1_sha(auVar135,auVar174);
  auVar130._0_4_ = auVar186._4_4_ + auVar163._0_4_;
  auVar130._4_4_ = auVar186._8_4_ + auVar163._4_4_;
  auVar130._8_4_ = auVar186._12_4_ + auVar163._8_4_;
  auVar130._12_4_ = auVar146._0_4_ + auVar163._12_4_;
  auVar163 = sha256msg2_sha(auVar117,auVar147);
  auVar129._0_4_ = auVar163._0_4_ + -0x1b64963f;
  auVar129._4_4_ = auVar163._4_4_ + -0x1041b87a;
  auVar129._8_4_ = auVar163._8_4_ + 0xfc19dc6;
  auVar129._12_4_ = auVar163._12_4_ + 0x240ca1cc;
  auVar152 = sha256rnds2_sha(auVar153,auVar154,auVar129);
  auVar135._4_4_ = auVar129._12_4_;
  auVar135._0_4_ = auVar129._8_4_;
  auVar135._8_4_ = auVar129._0_4_;
  auVar135._12_4_ = auVar129._0_4_;
  auVar157 = sha256rnds2_sha(auVar154,auVar152,auVar135);
  auVar153 = sha256msg2_sha(auVar130,auVar146);
  auVar5._0_4_ = auVar153._0_4_ + -0x1b64963f;
  auVar5._4_4_ = auVar153._4_4_ + -0x1041b87a;
  auVar5._8_4_ = auVar153._8_4_ + 0xfc19dc6;
  auVar5._12_4_ = auVar153._12_4_ + 0x240ca1cc;
  auVar158 = sha256rnds2_sha(auVar158,auVar164,auVar5);
  auVar6._4_4_ = auVar5._12_4_;
  auVar6._0_4_ = auVar5._8_4_;
  auVar6._8_4_ = auVar5._0_4_;
  auVar6._12_4_ = auVar5._0_4_;
  auVar164 = sha256rnds2_sha(auVar164,auVar158,auVar6);
  auVar104 = sha256msg1_sha(auVar104,auVar181);
  auVar136._0_4_ = auVar147._4_4_ + auVar104._0_4_;
  auVar136._4_4_ = auVar147._8_4_ + auVar104._4_4_;
  auVar136._8_4_ = auVar147._12_4_ + auVar104._8_4_;
  auVar136._12_4_ = auVar163._0_4_ + auVar104._12_4_;
  auVar104 = sha256msg1_sha(auVar174,auVar186);
  auVar169._0_4_ = auVar146._4_4_ + auVar104._0_4_;
  auVar169._4_4_ = auVar146._8_4_ + auVar104._4_4_;
  auVar169._8_4_ = auVar146._12_4_ + auVar104._8_4_;
  auVar169._12_4_ = auVar153._0_4_ + auVar104._12_4_;
  auVar154 = sha256msg2_sha(auVar136,auVar163);
  auVar174._0_4_ = auVar154._0_4_ + 0x2de92c6f;
  auVar174._4_4_ = auVar154._4_4_ + 0x4a7484aa;
  auVar174._8_4_ = auVar154._8_4_ + 0x5cb0a9dc;
  auVar174._12_4_ = auVar154._12_4_ + 0x76f988da;
  auVar104 = sha256rnds2_sha(auVar152,auVar157,auVar174);
  auVar7._4_4_ = auVar174._12_4_;
  auVar7._0_4_ = auVar174._8_4_;
  auVar7._8_4_ = auVar174._0_4_;
  auVar7._12_4_ = auVar174._0_4_;
  auVar152 = sha256rnds2_sha(auVar157,auVar104,auVar7);
  auVar170 = sha256msg2_sha(auVar169,auVar153);
  auVar8._0_4_ = auVar170._0_4_ + 0x2de92c6f;
  auVar8._4_4_ = auVar170._4_4_ + 0x4a7484aa;
  auVar8._8_4_ = auVar170._8_4_ + 0x5cb0a9dc;
  auVar8._12_4_ = auVar170._12_4_ + 0x76f988da;
  auVar158 = sha256rnds2_sha(auVar158,auVar164,auVar8);
  auVar9._4_4_ = auVar8._12_4_;
  auVar9._0_4_ = auVar8._8_4_;
  auVar9._8_4_ = auVar8._0_4_;
  auVar9._12_4_ = auVar8._0_4_;
  auVar164 = sha256rnds2_sha(auVar164,auVar158,auVar9);
  auVar157 = sha256msg1_sha(auVar181,auVar147);
  auVar177._0_4_ = auVar163._4_4_ + auVar157._0_4_;
  auVar177._4_4_ = auVar163._8_4_ + auVar157._4_4_;
  auVar177._8_4_ = auVar163._12_4_ + auVar157._8_4_;
  auVar177._12_4_ = auVar154._0_4_ + auVar157._12_4_;
  auVar157 = sha256msg1_sha(auVar186,auVar146);
  auVar182._0_4_ = auVar153._4_4_ + auVar157._0_4_;
  auVar182._4_4_ = auVar153._8_4_ + auVar157._4_4_;
  auVar182._8_4_ = auVar153._12_4_ + auVar157._8_4_;
  auVar182._12_4_ = auVar170._0_4_ + auVar157._12_4_;
  auVar178 = sha256msg2_sha(auVar177,auVar154);
  auVar181._0_4_ = auVar178._0_4_ + -0x67c1aeae;
  auVar181._4_4_ = auVar178._4_4_ + -0x57ce3993;
  auVar181._8_4_ = auVar178._8_4_ + -0x4ffcd838;
  auVar181._12_4_ = auVar178._12_4_ + -0x40a68039;
  auVar104 = sha256rnds2_sha(auVar104,auVar152,auVar181);
  auVar186._4_4_ = auVar181._12_4_;
  auVar186._0_4_ = auVar181._8_4_;
  auVar186._8_4_ = auVar181._0_4_;
  auVar186._12_4_ = auVar181._0_4_;
  auVar157 = sha256rnds2_sha(auVar152,auVar104,auVar186);
  auVar183 = sha256msg2_sha(auVar182,auVar170);
  auVar10._0_4_ = auVar183._0_4_ + -0x67c1aeae;
  auVar10._4_4_ = auVar183._4_4_ + -0x57ce3993;
  auVar10._8_4_ = auVar183._8_4_ + -0x4ffcd838;
  auVar10._12_4_ = auVar183._12_4_ + -0x40a68039;
  auVar158 = sha256rnds2_sha(auVar158,auVar164,auVar10);
  auVar11._4_4_ = auVar10._12_4_;
  auVar11._0_4_ = auVar10._8_4_;
  auVar11._8_4_ = auVar10._0_4_;
  auVar11._12_4_ = auVar10._0_4_;
  auVar164 = sha256rnds2_sha(auVar164,auVar158,auVar11);
  auVar147 = sha256msg1_sha(auVar147,auVar163);
  auVar187._0_4_ = auVar154._4_4_ + auVar147._0_4_;
  auVar187._4_4_ = auVar154._8_4_ + auVar147._4_4_;
  auVar187._8_4_ = auVar154._12_4_ + auVar147._8_4_;
  auVar187._12_4_ = auVar178._0_4_ + auVar147._12_4_;
  auVar147 = sha256msg1_sha(auVar146,auVar153);
  auVar94._0_4_ = auVar170._4_4_ + auVar147._0_4_;
  auVar94._4_4_ = auVar170._8_4_ + auVar147._4_4_;
  auVar94._8_4_ = auVar170._12_4_ + auVar147._8_4_;
  auVar94._12_4_ = auVar183._0_4_ + auVar147._12_4_;
  auVar188 = sha256msg2_sha(auVar187,auVar178);
  auVar12._0_4_ = auVar188._0_4_ + -0x391ff40d;
  auVar12._4_4_ = auVar188._4_4_ + -0x2a586eb9;
  auVar12._8_4_ = auVar188._8_4_ + 0x6ca6351;
  auVar12._12_4_ = auVar188._12_4_ + 0x14292967;
  auVar152 = sha256rnds2_sha(auVar104,auVar157,auVar12);
  auVar13._4_4_ = auVar12._12_4_;
  auVar13._0_4_ = auVar12._8_4_;
  auVar13._8_4_ = auVar12._0_4_;
  auVar13._12_4_ = auVar12._0_4_;
  auVar157 = sha256rnds2_sha(auVar157,auVar152,auVar13);
  auVar147 = sha256msg2_sha(auVar94,auVar183);
  auVar14._0_4_ = auVar147._0_4_ + -0x391ff40d;
  auVar14._4_4_ = auVar147._4_4_ + -0x2a586eb9;
  auVar14._8_4_ = auVar147._8_4_ + 0x6ca6351;
  auVar14._12_4_ = auVar147._12_4_ + 0x14292967;
  auVar158 = sha256rnds2_sha(auVar158,auVar164,auVar14);
  auVar15._4_4_ = auVar14._12_4_;
  auVar15._0_4_ = auVar14._8_4_;
  auVar15._8_4_ = auVar14._0_4_;
  auVar15._12_4_ = auVar14._0_4_;
  auVar164 = sha256rnds2_sha(auVar164,auVar158,auVar15);
  auVar104 = sha256msg1_sha(auVar163,auVar154);
  auVar139._0_4_ = auVar178._4_4_ + auVar104._0_4_;
  auVar139._4_4_ = auVar178._8_4_ + auVar104._4_4_;
  auVar139._8_4_ = auVar178._12_4_ + auVar104._8_4_;
  auVar139._12_4_ = auVar188._0_4_ + auVar104._12_4_;
  auVar104 = sha256msg1_sha(auVar153,auVar170);
  auVar118._0_4_ = auVar183._4_4_ + auVar104._0_4_;
  auVar118._4_4_ = auVar183._8_4_ + auVar104._4_4_;
  auVar118._8_4_ = auVar183._12_4_ + auVar104._8_4_;
  auVar118._12_4_ = auVar147._0_4_ + auVar104._12_4_;
  auVar146 = sha256msg2_sha(auVar139,auVar188);
  auVar16._0_4_ = auVar146._0_4_ + 0x27b70a85;
  auVar16._4_4_ = auVar146._4_4_ + 0x2e1b2138;
  auVar16._8_4_ = auVar146._8_4_ + 0x4d2c6dfc;
  auVar16._12_4_ = auVar146._12_4_ + 0x53380d13;
  auVar153 = sha256rnds2_sha(auVar152,auVar157,auVar16);
  auVar17._4_4_ = auVar16._12_4_;
  auVar17._0_4_ = auVar16._8_4_;
  auVar17._8_4_ = auVar16._0_4_;
  auVar17._12_4_ = auVar16._0_4_;
  auVar152 = sha256rnds2_sha(auVar157,auVar153,auVar17);
  auVar163 = sha256msg2_sha(auVar118,auVar147);
  auVar18._0_4_ = auVar163._0_4_ + 0x27b70a85;
  auVar18._4_4_ = auVar163._4_4_ + 0x2e1b2138;
  auVar18._8_4_ = auVar163._8_4_ + 0x4d2c6dfc;
  auVar18._12_4_ = auVar163._12_4_ + 0x53380d13;
  auVar157 = sha256rnds2_sha(auVar158,auVar164,auVar18);
  auVar19._4_4_ = auVar18._12_4_;
  auVar19._0_4_ = auVar18._8_4_;
  auVar19._8_4_ = auVar18._0_4_;
  auVar19._12_4_ = auVar18._0_4_;
  auVar158 = sha256rnds2_sha(auVar164,auVar157,auVar19);
  auVar104 = sha256msg1_sha(auVar154,auVar178);
  auVar105._0_4_ = auVar188._4_4_ + auVar104._0_4_;
  auVar105._4_4_ = auVar188._8_4_ + auVar104._4_4_;
  auVar105._8_4_ = auVar188._12_4_ + auVar104._8_4_;
  auVar105._12_4_ = auVar146._0_4_ + auVar104._12_4_;
  auVar104 = sha256msg1_sha(auVar170,auVar183);
  auVar20._0_4_ = auVar147._4_4_ + auVar104._0_4_;
  auVar20._4_4_ = auVar147._8_4_ + auVar104._4_4_;
  auVar20._8_4_ = auVar147._12_4_ + auVar104._8_4_;
  auVar20._12_4_ = auVar163._0_4_ + auVar104._12_4_;
  auVar104 = sha256msg2_sha(auVar105,auVar146);
  auVar21._0_4_ = auVar104._0_4_ + 0x650a7354;
  auVar21._4_4_ = auVar104._4_4_ + 0x766a0abb;
  auVar21._8_4_ = auVar104._8_4_ + -0x7e3d36d2;
  auVar21._12_4_ = auVar104._12_4_ + -0x6d8dd37b;
  auVar153 = sha256rnds2_sha(auVar153,auVar152,auVar21);
  auVar22._4_4_ = auVar21._12_4_;
  auVar22._0_4_ = auVar21._8_4_;
  auVar22._8_4_ = auVar21._0_4_;
  auVar22._12_4_ = auVar21._0_4_;
  auVar154 = sha256rnds2_sha(auVar152,auVar153,auVar22);
  auVar170 = sha256msg2_sha(auVar20,auVar163);
  auVar23._0_4_ = auVar170._0_4_ + 0x650a7354;
  auVar23._4_4_ = auVar170._4_4_ + 0x766a0abb;
  auVar23._8_4_ = auVar170._8_4_ + -0x7e3d36d2;
  auVar23._12_4_ = auVar170._12_4_ + -0x6d8dd37b;
  auVar152 = sha256rnds2_sha(auVar157,auVar158,auVar23);
  auVar24._4_4_ = auVar23._12_4_;
  auVar24._0_4_ = auVar23._8_4_;
  auVar24._8_4_ = auVar23._0_4_;
  auVar24._12_4_ = auVar23._0_4_;
  auVar164 = sha256rnds2_sha(auVar158,auVar152,auVar24);
  auVar157 = sha256msg1_sha(auVar178,auVar188);
  auVar175._0_4_ = auVar146._4_4_ + auVar157._0_4_;
  auVar175._4_4_ = auVar146._8_4_ + auVar157._4_4_;
  auVar175._8_4_ = auVar146._12_4_ + auVar157._8_4_;
  auVar175._12_4_ = auVar104._0_4_ + auVar157._12_4_;
  auVar157 = sha256msg1_sha(auVar183,auVar147);
  auVar179._0_4_ = auVar163._4_4_ + auVar157._0_4_;
  auVar179._4_4_ = auVar163._8_4_ + auVar157._4_4_;
  auVar179._8_4_ = auVar163._12_4_ + auVar157._8_4_;
  auVar179._12_4_ = auVar170._0_4_ + auVar157._12_4_;
  auVar178 = sha256msg2_sha(auVar175,auVar104);
  auVar25._0_4_ = auVar178._0_4_ + -0x5d40175f;
  auVar25._4_4_ = auVar178._4_4_ + -0x57e599b5;
  auVar25._8_4_ = auVar178._8_4_ + -0x3db47490;
  auVar25._12_4_ = auVar178._12_4_ + -0x3893ae5d;
  auVar153 = sha256rnds2_sha(auVar153,auVar154,auVar25);
  auVar26._4_4_ = auVar25._12_4_;
  auVar26._0_4_ = auVar25._8_4_;
  auVar26._8_4_ = auVar25._0_4_;
  auVar26._12_4_ = auVar25._0_4_;
  auVar157 = sha256rnds2_sha(auVar154,auVar153,auVar26);
  auVar183 = sha256msg2_sha(auVar179,auVar170);
  auVar27._0_4_ = auVar183._0_4_ + -0x5d40175f;
  auVar27._4_4_ = auVar183._4_4_ + -0x57e599b5;
  auVar27._8_4_ = auVar183._8_4_ + -0x3db47490;
  auVar27._12_4_ = auVar183._12_4_ + -0x3893ae5d;
  auVar158 = sha256rnds2_sha(auVar152,auVar164,auVar27);
  auVar28._4_4_ = auVar27._12_4_;
  auVar28._0_4_ = auVar27._8_4_;
  auVar28._8_4_ = auVar27._0_4_;
  auVar28._12_4_ = auVar27._0_4_;
  auVar164 = sha256rnds2_sha(auVar164,auVar158,auVar28);
  auVar154 = sha256msg1_sha(auVar188,auVar146);
  auVar137._0_4_ = auVar104._4_4_ + auVar154._0_4_;
  auVar137._4_4_ = auVar104._8_4_ + auVar154._4_4_;
  auVar137._8_4_ = auVar104._12_4_ + auVar154._8_4_;
  auVar137._12_4_ = auVar178._0_4_ + auVar154._12_4_;
  auVar147 = sha256msg1_sha(auVar147,auVar163);
  auVar131._0_4_ = auVar170._4_4_ + auVar147._0_4_;
  auVar131._4_4_ = auVar170._8_4_ + auVar147._4_4_;
  auVar131._8_4_ = auVar170._12_4_ + auVar147._8_4_;
  auVar131._12_4_ = auVar183._0_4_ + auVar147._12_4_;
  auVar154 = sha256msg2_sha(auVar137,auVar178);
  auVar29._0_4_ = auVar154._0_4_ + -0x2e6d17e7;
  auVar29._4_4_ = auVar154._4_4_ + -0x2966f9dc;
  auVar29._8_4_ = auVar154._8_4_ + -0xbf1ca7b;
  auVar29._12_4_ = auVar154._12_4_ + 0x106aa070;
  auVar152 = sha256rnds2_sha(auVar153,auVar157,auVar29);
  auVar30._4_4_ = auVar29._12_4_;
  auVar30._0_4_ = auVar29._8_4_;
  auVar30._8_4_ = auVar29._0_4_;
  auVar30._12_4_ = auVar29._0_4_;
  auVar157 = sha256rnds2_sha(auVar157,auVar152,auVar30);
  auVar153 = sha256msg2_sha(auVar131,auVar183);
  auVar31._0_4_ = auVar153._0_4_ + -0x2e6d17e7;
  auVar31._4_4_ = auVar153._4_4_ + -0x2966f9dc;
  auVar31._8_4_ = auVar153._8_4_ + -0xbf1ca7b;
  auVar31._12_4_ = auVar153._12_4_ + 0x106aa070;
  auVar158 = sha256rnds2_sha(auVar158,auVar164,auVar31);
  auVar32._4_4_ = auVar31._12_4_;
  auVar32._0_4_ = auVar31._8_4_;
  auVar32._8_4_ = auVar31._0_4_;
  auVar32._12_4_ = auVar31._0_4_;
  auVar164 = sha256rnds2_sha(auVar164,auVar158,auVar32);
  auVar147 = sha256msg1_sha(auVar146,auVar104);
  auVar33._0_4_ = auVar178._4_4_ + auVar147._0_4_;
  auVar33._4_4_ = auVar178._8_4_ + auVar147._4_4_;
  auVar33._8_4_ = auVar178._12_4_ + auVar147._8_4_;
  auVar33._12_4_ = auVar154._0_4_ + auVar147._12_4_;
  auVar147 = sha256msg1_sha(auVar163,auVar170);
  auVar140._0_4_ = auVar183._4_4_ + auVar147._0_4_;
  auVar140._4_4_ = auVar183._8_4_ + auVar147._4_4_;
  auVar140._8_4_ = auVar183._12_4_ + auVar147._8_4_;
  auVar140._12_4_ = auVar153._0_4_ + auVar147._12_4_;
  auVar104 = sha256msg1_sha(auVar104,auVar178);
  auVar147 = sha256msg2_sha(auVar33,auVar154);
  auVar95._0_4_ = auVar154._4_4_ + auVar104._0_4_;
  auVar95._4_4_ = auVar154._8_4_ + auVar104._4_4_;
  auVar95._8_4_ = auVar154._12_4_ + auVar104._8_4_;
  auVar95._12_4_ = auVar147._0_4_ + auVar104._12_4_;
  auVar178 = sha256msg1_sha(auVar178,auVar154);
  auVar163 = sha256msg2_sha(auVar95,auVar147);
  auVar154 = sha256msg1_sha(auVar154,auVar147);
  auVar34._0_4_ = auVar147._0_4_ + 0x19a4c116;
  auVar34._4_4_ = auVar147._4_4_ + 0x1e376c08;
  auVar34._8_4_ = auVar147._8_4_ + 0x2748774c;
  auVar34._12_4_ = auVar147._12_4_ + 0x34b0bcb5;
  auVar152 = sha256rnds2_sha(auVar152,auVar157,auVar34);
  auVar35._4_4_ = auVar34._12_4_;
  auVar35._0_4_ = auVar34._8_4_;
  auVar35._8_4_ = auVar34._0_4_;
  auVar35._12_4_ = auVar34._0_4_;
  auVar157 = sha256rnds2_sha(auVar157,auVar152,auVar35);
  auVar104 = sha256msg1_sha(auVar170,auVar183);
  auVar146 = sha256msg2_sha(auVar140,auVar153);
  auVar171._0_4_ = auVar153._4_4_ + auVar104._0_4_;
  auVar171._4_4_ = auVar153._8_4_ + auVar104._4_4_;
  auVar171._8_4_ = auVar153._12_4_ + auVar104._8_4_;
  auVar171._12_4_ = auVar146._0_4_ + auVar104._12_4_;
  auVar104 = sha256msg1_sha(auVar183,auVar153);
  auVar170 = sha256msg2_sha(auVar171,auVar146);
  auVar153 = sha256msg1_sha(auVar153,auVar146);
  auVar36._0_4_ = auVar146._0_4_ + 0x19a4c116;
  auVar36._4_4_ = auVar146._4_4_ + 0x1e376c08;
  auVar36._8_4_ = auVar146._8_4_ + 0x2748774c;
  auVar36._12_4_ = auVar146._12_4_ + 0x34b0bcb5;
  auVar158 = sha256rnds2_sha(auVar158,auVar164,auVar36);
  auVar37._4_4_ = auVar36._12_4_;
  auVar37._0_4_ = auVar36._8_4_;
  auVar37._8_4_ = auVar36._0_4_;
  auVar37._12_4_ = auVar36._0_4_;
  auVar164 = sha256rnds2_sha(auVar164,auVar158,auVar37);
  auVar106._0_4_ = auVar147._4_4_ + auVar178._0_4_;
  auVar106._4_4_ = auVar147._8_4_ + auVar178._4_4_;
  auVar106._8_4_ = auVar147._12_4_ + auVar178._8_4_;
  auVar106._12_4_ = auVar163._0_4_ + auVar178._12_4_;
  auVar147 = sha256msg2_sha(auVar106,auVar163);
  auVar38._0_4_ = auVar163._0_4_ + 0x391c0cb3;
  auVar38._4_4_ = auVar163._4_4_ + 0x4ed8aa4a;
  auVar38._8_4_ = auVar163._8_4_ + 0x5b9cca4f;
  auVar38._12_4_ = auVar163._12_4_ + 0x682e6ff3;
  auVar152 = sha256rnds2_sha(auVar152,auVar157,auVar38);
  auVar39._4_4_ = auVar38._12_4_;
  auVar39._0_4_ = auVar38._8_4_;
  auVar39._8_4_ = auVar38._0_4_;
  auVar39._12_4_ = auVar38._0_4_;
  auVar157 = sha256rnds2_sha(auVar157,auVar152,auVar39);
  auVar119._0_4_ = auVar146._4_4_ + auVar104._0_4_;
  auVar119._4_4_ = auVar146._8_4_ + auVar104._4_4_;
  auVar119._8_4_ = auVar146._12_4_ + auVar104._8_4_;
  auVar119._12_4_ = auVar170._0_4_ + auVar104._12_4_;
  auVar104 = sha256msg2_sha(auVar119,auVar170);
  auVar40._0_4_ = auVar170._0_4_ + 0x391c0cb3;
  auVar40._4_4_ = auVar170._4_4_ + 0x4ed8aa4a;
  auVar40._8_4_ = auVar170._8_4_ + 0x5b9cca4f;
  auVar40._12_4_ = auVar170._12_4_ + 0x682e6ff3;
  auVar146 = sha256rnds2_sha(auVar158,auVar164,auVar40);
  auVar41._4_4_ = auVar40._12_4_;
  auVar41._0_4_ = auVar40._8_4_;
  auVar41._8_4_ = auVar40._0_4_;
  auVar41._12_4_ = auVar40._0_4_;
  auVar158 = sha256rnds2_sha(auVar164,auVar146,auVar41);
  auVar189._0_4_ = auVar163._4_4_ + auVar154._0_4_;
  auVar189._4_4_ = auVar163._8_4_ + auVar154._4_4_;
  auVar189._8_4_ = auVar163._12_4_ + auVar154._8_4_;
  auVar189._12_4_ = auVar147._0_4_ + auVar154._12_4_;
  auVar164 = sha256msg2_sha(auVar189,auVar147);
  auVar42._0_4_ = auVar147._0_4_ + 0x748f82ee;
  auVar42._4_4_ = auVar147._4_4_ + 0x78a5636f;
  auVar42._8_4_ = auVar147._8_4_ + -0x7b3787ec;
  auVar42._12_4_ = auVar147._12_4_ + -0x7338fdf8;
  auVar147 = sha256rnds2_sha(auVar152,auVar157,auVar42);
  auVar43._4_4_ = auVar42._12_4_;
  auVar43._0_4_ = auVar42._8_4_;
  auVar43._8_4_ = auVar42._0_4_;
  auVar43._12_4_ = auVar42._0_4_;
  auVar163 = sha256rnds2_sha(auVar157,auVar147,auVar43);
  auVar184._0_4_ = auVar170._4_4_ + auVar153._0_4_;
  auVar184._4_4_ = auVar170._8_4_ + auVar153._4_4_;
  auVar184._8_4_ = auVar170._12_4_ + auVar153._8_4_;
  auVar184._12_4_ = auVar104._0_4_ + auVar153._12_4_;
  auVar154 = sha256msg2_sha(auVar184,auVar104);
  auVar44._0_4_ = auVar104._0_4_ + 0x748f82ee;
  auVar44._4_4_ = auVar104._4_4_ + 0x78a5636f;
  auVar44._8_4_ = auVar104._8_4_ + -0x7b3787ec;
  auVar44._12_4_ = auVar104._12_4_ + -0x7338fdf8;
  auVar153 = sha256rnds2_sha(auVar146,auVar158,auVar44);
  auVar45._4_4_ = auVar44._12_4_;
  auVar45._0_4_ = auVar44._8_4_;
  auVar45._8_4_ = auVar44._0_4_;
  auVar45._12_4_ = auVar44._0_4_;
  auVar146 = sha256rnds2_sha(auVar158,auVar153,auVar45);
  auVar190._0_4_ = auVar164._0_4_ + -0x6f410006;
  auVar190._4_4_ = auVar164._4_4_ + -0x5baf9315;
  auVar190._8_4_ = auVar164._8_4_ + -0x41065c09;
  auVar190._12_4_ = auVar164._12_4_ + -0x398e870e;
  auVar147 = sha256rnds2_sha(auVar147,auVar163,auVar190);
  auVar46._4_4_ = auVar190._12_4_;
  auVar46._0_4_ = auVar190._8_4_;
  auVar46._8_4_ = auVar190._0_4_;
  auVar46._12_4_ = auVar190._0_4_;
  auVar104 = sha256rnds2_sha(auVar163,auVar147,auVar46);
  auVar185._0_4_ = auVar154._0_4_ + -0x6f410006;
  auVar185._4_4_ = auVar154._4_4_ + -0x5baf9315;
  auVar185._8_4_ = auVar154._8_4_ + -0x41065c09;
  auVar185._12_4_ = auVar154._12_4_ + -0x398e870e;
  auVar154 = sha256rnds2_sha(auVar153,auVar146,auVar185);
  auVar47._4_4_ = auVar185._12_4_;
  auVar47._0_4_ = auVar185._8_4_;
  auVar47._8_4_ = auVar185._0_4_;
  auVar47._12_4_ = auVar185._0_4_;
  auVar146 = sha256rnds2_sha(auVar146,auVar154,auVar47);
  auVar155._0_4_ = auVar104._0_4_ + DAT_001ac4d0;
  auVar155._4_4_ = auVar104._4_4_ + DAT_001ac4d0._4_4_;
  auVar155._8_4_ = auVar104._8_4_ + DAT_001ac4d0._8_4_;
  auVar155._12_4_ = auVar104._12_4_ + DAT_001ac4d0._12_4_;
  auVar141._0_4_ = auVar147._0_4_ + DAT_001ac4e0;
  auVar141._4_4_ = auVar147._4_4_ + DAT_001ac4e0._4_4_;
  auVar141._8_4_ = auVar147._8_4_ + DAT_001ac4e0._8_4_;
  auVar141._12_4_ = auVar147._12_4_ + DAT_001ac4e0._12_4_;
  auVar153 = sha256rnds2_sha(auVar141,auVar155,_DAT_001ac4f0);
  auVar163 = sha256rnds2_sha(auVar155,auVar153,_DAT_001ac500);
  auVar165._0_4_ = auVar146._0_4_ + DAT_001ac4d0;
  auVar165._4_4_ = auVar146._4_4_ + DAT_001ac4d0._4_4_;
  auVar165._8_4_ = auVar146._8_4_ + DAT_001ac4d0._8_4_;
  auVar165._12_4_ = auVar146._12_4_ + DAT_001ac4d0._12_4_;
  auVar159._0_4_ = auVar154._0_4_ + DAT_001ac4e0;
  auVar159._4_4_ = auVar154._4_4_ + DAT_001ac4e0._4_4_;
  auVar159._8_4_ = auVar154._8_4_ + DAT_001ac4e0._8_4_;
  auVar159._12_4_ = auVar154._12_4_ + DAT_001ac4e0._12_4_;
  auVar104 = sha256rnds2_sha(auVar159,auVar165,_DAT_001ac4f0);
  auVar147 = sha256rnds2_sha(auVar165,auVar104,_DAT_001ac500);
  auVar153 = sha256rnds2_sha(auVar153,auVar163,_DAT_001ac3e0);
  auVar163 = sha256rnds2_sha(auVar163,auVar153,_DAT_001ac510);
  auVar104 = sha256rnds2_sha(auVar104,auVar147,_DAT_001ac3e0);
  auVar147 = sha256rnds2_sha(auVar147,auVar104,_DAT_001ac510);
  auVar153 = sha256rnds2_sha(auVar153,auVar163,_DAT_001ac3f0);
  auVar163 = sha256rnds2_sha(auVar163,auVar153,_DAT_001ac520);
  auVar104 = sha256rnds2_sha(auVar104,auVar147,_DAT_001ac3f0);
  auVar147 = sha256rnds2_sha(auVar147,auVar104,_DAT_001ac520);
  auVar153 = sha256rnds2_sha(auVar153,auVar163,_DAT_001ac530);
  auVar163 = sha256rnds2_sha(auVar163,auVar153,_DAT_001ac540);
  auVar104 = sha256rnds2_sha(auVar104,auVar147,_DAT_001ac530);
  auVar147 = sha256rnds2_sha(auVar147,auVar104,_DAT_001ac540);
  auVar153 = sha256rnds2_sha(auVar153,auVar163,_DAT_001ac550);
  auVar163 = sha256rnds2_sha(auVar163,auVar153,_DAT_001ac560);
  auVar104 = sha256rnds2_sha(auVar104,auVar147,_DAT_001ac550);
  auVar147 = sha256rnds2_sha(auVar147,auVar104,_DAT_001ac560);
  auVar153 = sha256rnds2_sha(auVar153,auVar163,_DAT_001ac570);
  auVar163 = sha256rnds2_sha(auVar163,auVar153,_DAT_001ac580);
  auVar104 = sha256rnds2_sha(auVar104,auVar147,_DAT_001ac570);
  auVar147 = sha256rnds2_sha(auVar147,auVar104,_DAT_001ac580);
  auVar153 = sha256rnds2_sha(auVar153,auVar163,_DAT_001ac590);
  auVar163 = sha256rnds2_sha(auVar163,auVar153,_DAT_001ac5a0);
  auVar104 = sha256rnds2_sha(auVar104,auVar147,_DAT_001ac590);
  auVar147 = sha256rnds2_sha(auVar147,auVar104,_DAT_001ac5a0);
  auVar153 = sha256rnds2_sha(auVar153,auVar163,_DAT_001ac5b0);
  auVar163 = sha256rnds2_sha(auVar163,auVar153,_DAT_001ac5c0);
  auVar104 = sha256rnds2_sha(auVar104,auVar147,_DAT_001ac5b0);
  auVar147 = sha256rnds2_sha(auVar147,auVar104,_DAT_001ac5c0);
  auVar153 = sha256rnds2_sha(auVar153,auVar163,_DAT_001ac5d0);
  auVar163 = sha256rnds2_sha(auVar163,auVar153,_DAT_001ac5e0);
  auVar104 = sha256rnds2_sha(auVar104,auVar147,_DAT_001ac5d0);
  auVar147 = sha256rnds2_sha(auVar147,auVar104,_DAT_001ac5e0);
  auVar153 = sha256rnds2_sha(auVar153,auVar163,_DAT_001ac5f0);
  auVar163 = sha256rnds2_sha(auVar163,auVar153,_DAT_001ac600);
  auVar104 = sha256rnds2_sha(auVar104,auVar147,_DAT_001ac5f0);
  auVar147 = sha256rnds2_sha(auVar147,auVar104,_DAT_001ac600);
  auVar153 = sha256rnds2_sha(auVar153,auVar163,_DAT_001ac610);
  auVar163 = sha256rnds2_sha(auVar163,auVar153,_DAT_001ac620);
  auVar104 = sha256rnds2_sha(auVar104,auVar147,_DAT_001ac610);
  auVar147 = sha256rnds2_sha(auVar147,auVar104,_DAT_001ac620);
  auVar153 = sha256rnds2_sha(auVar153,auVar163,_DAT_001ac630);
  auVar163 = sha256rnds2_sha(auVar163,auVar153,_DAT_001ac640);
  auVar104 = sha256rnds2_sha(auVar104,auVar147,_DAT_001ac630);
  auVar147 = sha256rnds2_sha(auVar147,auVar104,_DAT_001ac640);
  auVar153 = sha256rnds2_sha(auVar153,auVar163,_DAT_001ac650);
  auVar163 = sha256rnds2_sha(auVar163,auVar153,_DAT_001ac660);
  auVar104 = sha256rnds2_sha(auVar104,auVar147,_DAT_001ac650);
  auVar147 = sha256rnds2_sha(auVar147,auVar104,_DAT_001ac660);
  auVar153 = sha256rnds2_sha(auVar153,auVar163,_DAT_001ac670);
  auVar163 = sha256rnds2_sha(auVar163,auVar153,_DAT_001ac680);
  auVar104 = sha256rnds2_sha(auVar104,auVar147,_DAT_001ac670);
  auVar147 = sha256rnds2_sha(auVar147,auVar104,_DAT_001ac680);
  auVar153 = sha256rnds2_sha(auVar153,auVar163,_DAT_001ac690);
  auVar163 = sha256rnds2_sha(auVar163,auVar153,_DAT_001ac6a0);
  auVar104 = sha256rnds2_sha(auVar104,auVar147,_DAT_001ac690);
  auVar147 = sha256rnds2_sha(auVar147,auVar104,_DAT_001ac6a0);
  auVar153 = sha256rnds2_sha(auVar153,auVar163,_DAT_001ac6b0);
  auVar163 = sha256rnds2_sha(auVar163,auVar153,_DAT_001ac6c0);
  auVar104 = sha256rnds2_sha(auVar104,auVar147,_DAT_001ac6b0);
  auVar147 = sha256rnds2_sha(auVar147,auVar104,_DAT_001ac6c0);
  iVar128 = auVar163._0_4_ + auVar155._0_4_;
  iVar133 = auVar163._4_4_ + auVar155._4_4_;
  iVar93 = auVar147._0_4_ + auVar165._0_4_;
  iVar102 = auVar147._4_4_ + auVar165._4_4_;
  iVar134 = auVar153._0_4_ + auVar141._0_4_;
  iVar138 = auVar153._4_4_ + auVar141._4_4_;
  iVar103 = auVar104._0_4_ + auVar159._0_4_;
  iVar115 = auVar104._4_4_ + auVar159._4_4_;
  auVar48._4_4_ = auVar163._8_4_ + auVar155._8_4_;
  auVar48._0_4_ = auVar163._12_4_ + auVar155._12_4_;
  auVar48._8_4_ = iVar133;
  auVar48._12_4_ = iVar128;
  auVar142._4_4_ = iVar134;
  auVar142._0_4_ = iVar138;
  auVar142._8_4_ = auVar153._12_4_ + auVar141._12_4_;
  auVar142._12_4_ = auVar153._8_4_ + auVar141._8_4_;
  auVar153 = pblendw(auVar48,auVar142,0xf0);
  auVar2._16_16_ = auVar142;
  auVar2._0_16_ = auVar48;
  auVar49._4_4_ = auVar147._8_4_ + auVar165._8_4_;
  auVar49._0_4_ = auVar147._12_4_ + auVar165._12_4_;
  auVar49._8_4_ = iVar102;
  auVar49._12_4_ = iVar93;
  auVar120._4_4_ = iVar103;
  auVar120._0_4_ = iVar115;
  auVar120._8_4_ = auVar104._12_4_ + auVar159._12_4_;
  auVar120._12_4_ = auVar104._8_4_ + auVar159._8_4_;
  auVar147 = pblendw(auVar49,auVar120,0xf0);
  auVar3._16_16_ = auVar120;
  auVar3._0_16_ = auVar49;
  auVar50._0_4_ = auVar153._0_4_ + 0x428a2f98;
  auVar50._4_4_ = auVar153._4_4_ + 0x71374491;
  auVar50._8_4_ = auVar153._8_4_ + -0x4a3f0431;
  auVar50._12_4_ = auVar153._12_4_ + -0x164a245b;
  auVar104 = sha256rnds2_sha(_DAT_001ac4e0,_DAT_001ac4d0,auVar50);
  auVar51._4_4_ = auVar50._12_4_;
  auVar51._0_4_ = auVar50._8_4_;
  auVar51._8_4_ = auVar50._0_4_;
  auVar51._12_4_ = auVar50._0_4_;
  auVar154 = sha256rnds2_sha(_DAT_001ac4d0,auVar104,auVar51);
  auVar160._0_4_ = auVar147._0_4_ + 0x428a2f98;
  auVar160._4_4_ = auVar147._4_4_ + 0x71374491;
  auVar160._8_4_ = auVar147._8_4_ + -0x4a3f0431;
  auVar160._12_4_ = auVar147._12_4_ + -0x164a245b;
  auVar163 = sha256rnds2_sha(_DAT_001ac4e0,_DAT_001ac4d0,auVar160);
  auVar52._4_4_ = auVar160._12_4_;
  auVar52._0_4_ = auVar160._8_4_;
  auVar52._8_4_ = auVar160._0_4_;
  auVar52._12_4_ = auVar160._0_4_;
  auVar146 = sha256rnds2_sha(_DAT_001ac4d0,auVar163,auVar52);
  auVar53._0_4_ = iVar133 + (int)DAT_001ac3e0;
  auVar53._4_4_ = iVar128 + DAT_001ac3e0._4_4_;
  auVar53._8_4_ = iVar138 + DAT_001ac3e0._8_4_;
  auVar53._12_4_ = iVar134 + DAT_001ac3e0._12_4_;
  auVar104 = sha256rnds2_sha(auVar104,auVar154,auVar53);
  auVar54._4_4_ = auVar53._12_4_;
  auVar54._0_4_ = auVar53._8_4_;
  auVar54._8_4_ = auVar53._0_4_;
  auVar54._12_4_ = auVar53._0_4_;
  auVar154 = sha256rnds2_sha(auVar154,auVar104,auVar54);
  auVar107._0_4_ = (int)DAT_001ac3e0 + iVar102;
  auVar107._4_4_ = DAT_001ac3e0._4_4_ + iVar93;
  auVar107._8_4_ = DAT_001ac3e0._8_4_ + iVar115;
  auVar107._12_4_ = DAT_001ac3e0._12_4_ + iVar103;
  auVar163 = sha256rnds2_sha(auVar163,auVar146,auVar107);
  auVar55._4_4_ = auVar107._12_4_;
  auVar55._0_4_ = auVar107._8_4_;
  auVar55._8_4_ = auVar107._0_4_;
  auVar55._12_4_ = auVar107._0_4_;
  auVar146 = sha256rnds2_sha(auVar146,auVar163,auVar55);
  auVar104 = sha256rnds2_sha(auVar104,auVar154,_DAT_001ac6d0);
  auVar154 = sha256rnds2_sha(auVar154,auVar104,_DAT_001ac6e0);
  auVar163 = sha256rnds2_sha(auVar163,auVar146,_DAT_001ac6d0);
  auVar146 = sha256rnds2_sha(auVar146,auVar163,_DAT_001ac6e0);
  auVar104 = sha256rnds2_sha(auVar104,auVar154,_DAT_001ac700);
  auVar154 = sha256rnds2_sha(auVar154,auVar104,_DAT_001ac710);
  auVar163 = sha256rnds2_sha(auVar163,auVar146,_DAT_001ac700);
  auVar152 = sha256rnds2_sha(auVar146,auVar163,_DAT_001ac710);
  auVar153 = sha256msg1_sha(auVar153,auVar2._8_16_);
  auVar157 = sha256msg2_sha(auVar153,_DAT_001ac720);
  auVar56._0_4_ = auVar157._0_4_ + -0x1b64963f;
  auVar56._4_4_ = auVar157._4_4_ + -0x1041b87a;
  auVar56._8_4_ = auVar157._8_4_ + 0xfc19dc6;
  auVar56._12_4_ = auVar157._12_4_ + 0x240ca1cc;
  auVar153 = sha256rnds2_sha(auVar104,auVar154,auVar56);
  auVar57._4_4_ = auVar56._12_4_;
  auVar57._0_4_ = auVar56._8_4_;
  auVar57._8_4_ = auVar56._0_4_;
  auVar57._12_4_ = auVar56._0_4_;
  auVar146 = sha256rnds2_sha(auVar154,auVar153,auVar57);
  auVar147 = sha256msg1_sha(auVar147,auVar3._8_16_);
  auVar104 = sha256msg2_sha(auVar147,_DAT_001ac720);
  auVar148._0_4_ = auVar104._0_4_ + -0x1b64963f;
  auVar148._4_4_ = auVar104._4_4_ + -0x1041b87a;
  auVar148._8_4_ = auVar104._8_4_ + 0xfc19dc6;
  auVar148._12_4_ = auVar104._12_4_ + 0x240ca1cc;
  auVar154 = sha256rnds2_sha(auVar163,auVar152,auVar148);
  auVar58._4_4_ = auVar148._12_4_;
  auVar58._0_4_ = auVar148._8_4_;
  auVar58._8_4_ = auVar148._0_4_;
  auVar58._12_4_ = auVar148._0_4_;
  auVar158 = sha256rnds2_sha(auVar152,auVar154,auVar58);
  auVar166._0_12_ = ZEXT812(0x80000000);
  auVar166._12_4_ = 0;
  auVar163 = sha256msg1_sha(auVar2._8_16_,auVar166);
  auVar147 = pmovsxwd(auVar58,0x100000000000000);
  auVar149._0_4_ = auVar147._4_4_ + auVar163._0_4_;
  auVar149._4_4_ = auVar147._8_4_ + auVar163._4_4_;
  auVar149._8_4_ = auVar147._12_4_ + auVar163._8_4_;
  auVar149._12_4_ = auVar157._0_4_ + auVar163._12_4_;
  auVar163 = sha256msg1_sha(auVar3._8_16_,auVar166);
  auVar176._0_4_ = auVar147._4_4_ + auVar163._0_4_;
  auVar176._4_4_ = auVar147._8_4_ + auVar163._4_4_;
  auVar176._8_4_ = auVar147._12_4_ + auVar163._8_4_;
  auVar176._12_4_ = auVar104._0_4_ + auVar163._12_4_;
  auVar152 = sha256msg2_sha(auVar149,auVar157);
  auVar59._0_4_ = auVar152._0_4_ + 0x2de92c6f;
  auVar59._4_4_ = auVar152._4_4_ + 0x4a7484aa;
  auVar59._8_4_ = auVar152._8_4_ + 0x5cb0a9dc;
  auVar59._12_4_ = auVar152._12_4_ + 0x76f988da;
  auVar147 = sha256rnds2_sha(auVar153,auVar146,auVar59);
  auVar60._4_4_ = auVar59._12_4_;
  auVar60._0_4_ = auVar59._8_4_;
  auVar60._8_4_ = auVar59._0_4_;
  auVar60._12_4_ = auVar59._0_4_;
  auVar146 = sha256rnds2_sha(auVar146,auVar147,auVar60);
  auVar178 = sha256msg2_sha(auVar176,auVar104);
  auVar121._0_4_ = auVar178._0_4_ + 0x2de92c6f;
  auVar121._4_4_ = auVar178._4_4_ + 0x4a7484aa;
  auVar121._8_4_ = auVar178._8_4_ + 0x5cb0a9dc;
  auVar121._12_4_ = auVar178._12_4_ + 0x76f988da;
  auVar153 = sha256rnds2_sha(auVar154,auVar158,auVar121);
  auVar61._4_4_ = auVar121._12_4_;
  auVar61._0_4_ = auVar121._8_4_;
  auVar61._8_4_ = auVar121._0_4_;
  auVar61._12_4_ = auVar121._0_4_;
  auVar164 = sha256rnds2_sha(auVar158,auVar153,auVar61);
  auVar163 = sha256msg1_sha(auVar166,_DAT_001ac720);
  auVar161._0_4_ = auVar157._4_4_ + auVar163._0_4_;
  auVar161._4_4_ = auVar157._8_4_ + auVar163._4_4_;
  auVar161._8_4_ = auVar157._12_4_ + auVar163._8_4_;
  auVar161._12_4_ = auVar152._0_4_ + auVar163._12_4_;
  auVar143._0_4_ = auVar104._4_4_ + auVar163._0_4_;
  auVar143._4_4_ = auVar104._8_4_ + auVar163._4_4_;
  auVar143._8_4_ = auVar104._12_4_ + auVar163._8_4_;
  auVar143._12_4_ = auVar178._0_4_ + auVar163._12_4_;
  auVar158 = sha256msg2_sha(auVar161,auVar152);
  auVar62._0_4_ = auVar158._0_4_ + -0x67c1aeae;
  auVar62._4_4_ = auVar158._4_4_ + -0x57ce3993;
  auVar62._8_4_ = auVar158._8_4_ + -0x4ffcd838;
  auVar62._12_4_ = auVar158._12_4_ + -0x40a68039;
  auVar163 = sha256rnds2_sha(auVar147,auVar146,auVar62);
  auVar63._4_4_ = auVar62._12_4_;
  auVar63._0_4_ = auVar62._8_4_;
  auVar63._8_4_ = auVar62._0_4_;
  auVar63._12_4_ = auVar62._0_4_;
  auVar170 = sha256rnds2_sha(auVar146,auVar163,auVar63);
  auVar146 = sha256msg2_sha(auVar143,auVar178);
  auVar122._0_4_ = auVar146._0_4_ + -0x67c1aeae;
  auVar122._4_4_ = auVar146._4_4_ + -0x57ce3993;
  auVar122._8_4_ = auVar146._8_4_ + -0x4ffcd838;
  auVar122._12_4_ = auVar146._12_4_ + -0x40a68039;
  auVar154 = sha256rnds2_sha(auVar153,auVar164,auVar122);
  auVar64._4_4_ = auVar122._12_4_;
  auVar64._0_4_ = auVar122._8_4_;
  auVar64._8_4_ = auVar122._0_4_;
  auVar64._12_4_ = auVar122._0_4_;
  auVar183 = sha256rnds2_sha(auVar164,auVar154,auVar64);
  auVar147 = sha256msg1_sha(_DAT_001ac720,auVar157);
  auVar167._0_4_ = auVar152._4_4_ + auVar147._0_4_;
  auVar167._4_4_ = auVar152._8_4_ + auVar147._4_4_;
  auVar167._8_4_ = auVar152._12_4_ + auVar147._8_4_;
  auVar167._12_4_ = auVar158._0_4_ + auVar147._12_4_;
  auVar147 = sha256msg1_sha(_DAT_001ac720,auVar104);
  auVar123._0_4_ = auVar178._4_4_ + auVar147._0_4_;
  auVar123._4_4_ = auVar178._8_4_ + auVar147._4_4_;
  auVar123._8_4_ = auVar178._12_4_ + auVar147._8_4_;
  auVar123._12_4_ = auVar146._0_4_ + auVar147._12_4_;
  auVar164 = sha256msg2_sha(auVar167,auVar158);
  auVar65._0_4_ = auVar164._0_4_ + -0x391ff40d;
  auVar65._4_4_ = auVar164._4_4_ + -0x2a586eb9;
  auVar65._8_4_ = auVar164._8_4_ + 0x6ca6351;
  auVar65._12_4_ = auVar164._12_4_ + 0x14292967;
  auVar153 = sha256rnds2_sha(auVar163,auVar170,auVar65);
  auVar66._4_4_ = auVar65._12_4_;
  auVar66._0_4_ = auVar65._8_4_;
  auVar66._8_4_ = auVar65._0_4_;
  auVar66._12_4_ = auVar65._0_4_;
  auVar170 = sha256rnds2_sha(auVar170,auVar153,auVar66);
  auVar163 = sha256msg2_sha(auVar123,auVar146);
  auVar108._0_4_ = auVar163._0_4_ + -0x391ff40d;
  auVar108._4_4_ = auVar163._4_4_ + -0x2a586eb9;
  auVar108._8_4_ = auVar163._8_4_ + 0x6ca6351;
  auVar108._12_4_ = auVar163._12_4_ + 0x14292967;
  auVar154 = sha256rnds2_sha(auVar154,auVar183,auVar108);
  auVar67._4_4_ = auVar108._12_4_;
  auVar67._0_4_ = auVar108._8_4_;
  auVar67._8_4_ = auVar108._0_4_;
  auVar67._12_4_ = auVar108._0_4_;
  auVar183 = sha256rnds2_sha(auVar183,auVar154,auVar67);
  auVar147 = sha256msg1_sha(auVar157,auVar152);
  auVar109._0_4_ = auVar158._4_4_ + auVar147._0_4_;
  auVar109._4_4_ = auVar158._8_4_ + auVar147._4_4_;
  auVar109._8_4_ = auVar158._12_4_ + auVar147._8_4_;
  auVar109._12_4_ = auVar164._0_4_ + auVar147._12_4_;
  auVar147 = sha256msg1_sha(auVar104,auVar178);
  auVar172._0_4_ = auVar146._4_4_ + auVar147._0_4_;
  auVar172._4_4_ = auVar146._8_4_ + auVar147._4_4_;
  auVar172._8_4_ = auVar146._12_4_ + auVar147._8_4_;
  auVar172._12_4_ = auVar163._0_4_ + auVar147._12_4_;
  auVar104 = sha256msg2_sha(auVar109,auVar164);
  auVar68._0_4_ = auVar104._0_4_ + 0x27b70a85;
  auVar68._4_4_ = auVar104._4_4_ + 0x2e1b2138;
  auVar68._8_4_ = auVar104._8_4_ + 0x4d2c6dfc;
  auVar68._12_4_ = auVar104._12_4_ + 0x53380d13;
  auVar153 = sha256rnds2_sha(auVar153,auVar170,auVar68);
  auVar69._4_4_ = auVar68._12_4_;
  auVar69._0_4_ = auVar68._8_4_;
  auVar69._8_4_ = auVar68._0_4_;
  auVar69._12_4_ = auVar68._0_4_;
  auVar157 = sha256rnds2_sha(auVar170,auVar153,auVar69);
  auVar170 = sha256msg2_sha(auVar172,auVar163);
  auVar96._0_4_ = auVar170._0_4_ + 0x27b70a85;
  auVar96._4_4_ = auVar170._4_4_ + 0x2e1b2138;
  auVar96._8_4_ = auVar170._8_4_ + 0x4d2c6dfc;
  auVar96._12_4_ = auVar170._12_4_ + 0x53380d13;
  auVar154 = sha256rnds2_sha(auVar154,auVar183,auVar96);
  auVar70._4_4_ = auVar96._12_4_;
  auVar70._0_4_ = auVar96._8_4_;
  auVar70._8_4_ = auVar96._0_4_;
  auVar70._12_4_ = auVar96._0_4_;
  auVar188 = sha256rnds2_sha(auVar183,auVar154,auVar70);
  auVar147 = sha256msg1_sha(auVar152,auVar158);
  auVar97._0_4_ = auVar164._4_4_ + auVar147._0_4_;
  auVar97._4_4_ = auVar164._8_4_ + auVar147._4_4_;
  auVar97._8_4_ = auVar164._12_4_ + auVar147._8_4_;
  auVar97._12_4_ = auVar104._0_4_ + auVar147._12_4_;
  auVar147 = sha256msg1_sha(auVar178,auVar146);
  auVar180._0_4_ = auVar163._4_4_ + auVar147._0_4_;
  auVar180._4_4_ = auVar163._8_4_ + auVar147._4_4_;
  auVar180._8_4_ = auVar163._12_4_ + auVar147._8_4_;
  auVar180._12_4_ = auVar170._0_4_ + auVar147._12_4_;
  auVar147 = sha256msg2_sha(auVar97,auVar104);
  auVar71._0_4_ = auVar147._0_4_ + 0x650a7354;
  auVar71._4_4_ = auVar147._4_4_ + 0x766a0abb;
  auVar71._8_4_ = auVar147._8_4_ + -0x7e3d36d2;
  auVar71._12_4_ = auVar147._12_4_ + -0x6d8dd37b;
  auVar153 = sha256rnds2_sha(auVar153,auVar157,auVar71);
  auVar72._4_4_ = auVar71._12_4_;
  auVar72._0_4_ = auVar71._8_4_;
  auVar72._8_4_ = auVar71._0_4_;
  auVar72._12_4_ = auVar71._0_4_;
  auVar183 = sha256rnds2_sha(auVar157,auVar153,auVar72);
  auVar178 = sha256msg2_sha(auVar180,auVar170);
  auVar150._0_4_ = auVar178._0_4_ + 0x650a7354;
  auVar150._4_4_ = auVar178._4_4_ + 0x766a0abb;
  auVar150._8_4_ = auVar178._8_4_ + -0x7e3d36d2;
  auVar150._12_4_ = auVar178._12_4_ + -0x6d8dd37b;
  auVar154 = sha256rnds2_sha(auVar154,auVar188,auVar150);
  auVar73._4_4_ = auVar150._12_4_;
  auVar73._0_4_ = auVar150._8_4_;
  auVar73._8_4_ = auVar150._0_4_;
  auVar73._12_4_ = auVar150._0_4_;
  auVar188 = sha256rnds2_sha(auVar188,auVar154,auVar73);
  auVar152 = sha256msg1_sha(auVar158,auVar164);
  auVar156._0_4_ = auVar104._4_4_ + auVar152._0_4_;
  auVar156._4_4_ = auVar104._8_4_ + auVar152._4_4_;
  auVar156._8_4_ = auVar104._12_4_ + auVar152._8_4_;
  auVar156._12_4_ = auVar147._0_4_ + auVar152._12_4_;
  auVar146 = sha256msg1_sha(auVar146,auVar163);
  auVar162._0_4_ = auVar170._4_4_ + auVar146._0_4_;
  auVar162._4_4_ = auVar170._8_4_ + auVar146._4_4_;
  auVar162._8_4_ = auVar170._12_4_ + auVar146._8_4_;
  auVar162._12_4_ = auVar178._0_4_ + auVar146._12_4_;
  auVar157 = sha256msg2_sha(auVar156,auVar147);
  auVar74._0_4_ = auVar157._0_4_ + -0x5d40175f;
  auVar74._4_4_ = auVar157._4_4_ + -0x57e599b5;
  auVar74._8_4_ = auVar157._8_4_ + -0x3db47490;
  auVar74._12_4_ = auVar157._12_4_ + -0x3893ae5d;
  auVar153 = sha256rnds2_sha(auVar153,auVar183,auVar74);
  auVar75._4_4_ = auVar74._12_4_;
  auVar75._0_4_ = auVar74._8_4_;
  auVar75._8_4_ = auVar74._0_4_;
  auVar75._12_4_ = auVar74._0_4_;
  auVar183 = sha256rnds2_sha(auVar183,auVar153,auVar75);
  auVar158 = sha256msg2_sha(auVar162,auVar178);
  auVar144._0_4_ = auVar158._0_4_ + -0x5d40175f;
  auVar144._4_4_ = auVar158._4_4_ + -0x57e599b5;
  auVar144._8_4_ = auVar158._8_4_ + -0x3db47490;
  auVar144._12_4_ = auVar158._12_4_ + -0x3893ae5d;
  auVar154 = sha256rnds2_sha(auVar154,auVar188,auVar144);
  auVar76._4_4_ = auVar144._12_4_;
  auVar76._0_4_ = auVar144._8_4_;
  auVar76._8_4_ = auVar144._0_4_;
  auVar76._12_4_ = auVar144._0_4_;
  auVar188 = sha256rnds2_sha(auVar188,auVar154,auVar76);
  auVar146 = sha256msg1_sha(auVar164,auVar104);
  auVar151._0_4_ = auVar147._4_4_ + auVar146._0_4_;
  auVar151._4_4_ = auVar147._8_4_ + auVar146._4_4_;
  auVar151._8_4_ = auVar147._12_4_ + auVar146._8_4_;
  auVar151._12_4_ = auVar157._0_4_ + auVar146._12_4_;
  auVar163 = sha256msg1_sha(auVar163,auVar170);
  auVar145._0_4_ = auVar178._4_4_ + auVar163._0_4_;
  auVar145._4_4_ = auVar178._8_4_ + auVar163._4_4_;
  auVar145._8_4_ = auVar178._12_4_ + auVar163._8_4_;
  auVar145._12_4_ = auVar158._0_4_ + auVar163._12_4_;
  auVar152 = sha256msg2_sha(auVar151,auVar157);
  auVar77._0_4_ = auVar152._0_4_ + -0x2e6d17e7;
  auVar77._4_4_ = auVar152._4_4_ + -0x2966f9dc;
  auVar77._8_4_ = auVar152._8_4_ + -0xbf1ca7b;
  auVar77._12_4_ = auVar152._12_4_ + 0x106aa070;
  auVar153 = sha256rnds2_sha(auVar153,auVar183,auVar77);
  auVar78._4_4_ = auVar77._12_4_;
  auVar78._0_4_ = auVar77._8_4_;
  auVar78._8_4_ = auVar77._0_4_;
  auVar78._12_4_ = auVar77._0_4_;
  auVar164 = sha256rnds2_sha(auVar183,auVar153,auVar78);
  auVar146 = sha256msg2_sha(auVar145,auVar158);
  auVar124._0_4_ = auVar146._0_4_ + -0x2e6d17e7;
  auVar124._4_4_ = auVar146._4_4_ + -0x2966f9dc;
  auVar124._8_4_ = auVar146._8_4_ + -0xbf1ca7b;
  auVar124._12_4_ = auVar146._12_4_ + 0x106aa070;
  auVar154 = sha256rnds2_sha(auVar154,auVar188,auVar124);
  auVar79._4_4_ = auVar124._12_4_;
  auVar79._0_4_ = auVar124._8_4_;
  auVar79._8_4_ = auVar124._0_4_;
  auVar79._12_4_ = auVar124._0_4_;
  auVar183 = sha256rnds2_sha(auVar188,auVar154,auVar79);
  auVar104 = sha256msg1_sha(auVar104,auVar147);
  auVar80._0_4_ = auVar157._4_4_ + auVar104._0_4_;
  auVar80._4_4_ = auVar157._8_4_ + auVar104._4_4_;
  auVar80._8_4_ = auVar157._12_4_ + auVar104._8_4_;
  auVar80._12_4_ = auVar152._0_4_ + auVar104._12_4_;
  auVar104 = sha256msg1_sha(auVar170,auVar178);
  auVar110._0_4_ = auVar158._4_4_ + auVar104._0_4_;
  auVar110._4_4_ = auVar158._8_4_ + auVar104._4_4_;
  auVar110._8_4_ = auVar158._12_4_ + auVar104._8_4_;
  auVar110._12_4_ = auVar146._0_4_ + auVar104._12_4_;
  auVar104 = sha256msg1_sha(auVar147,auVar157);
  auVar147 = sha256msg2_sha(auVar80,auVar152);
  auVar125._0_4_ = auVar152._4_4_ + auVar104._0_4_;
  auVar125._4_4_ = auVar152._8_4_ + auVar104._4_4_;
  auVar125._8_4_ = auVar152._12_4_ + auVar104._8_4_;
  auVar125._12_4_ = auVar147._0_4_ + auVar104._12_4_;
  auVar157 = sha256msg1_sha(auVar157,auVar152);
  auVar163 = sha256msg2_sha(auVar125,auVar147);
  auVar152 = sha256msg1_sha(auVar152,auVar147);
  auVar81._0_4_ = auVar147._0_4_ + 0x19a4c116;
  auVar81._4_4_ = auVar147._4_4_ + 0x1e376c08;
  auVar81._8_4_ = auVar147._8_4_ + 0x2748774c;
  auVar81._12_4_ = auVar147._12_4_ + 0x34b0bcb5;
  auVar153 = sha256rnds2_sha(auVar153,auVar164,auVar81);
  auVar82._4_4_ = auVar81._12_4_;
  auVar82._0_4_ = auVar81._8_4_;
  auVar82._8_4_ = auVar81._0_4_;
  auVar82._12_4_ = auVar81._0_4_;
  auVar170 = sha256rnds2_sha(auVar164,auVar153,auVar82);
  auVar104 = sha256msg2_sha(auVar110,auVar146);
  auVar98._0_4_ = auVar104._0_4_ + 0x19a4c116;
  auVar98._4_4_ = auVar104._4_4_ + 0x1e376c08;
  auVar98._8_4_ = auVar104._8_4_ + 0x2748774c;
  auVar98._12_4_ = auVar104._12_4_ + 0x34b0bcb5;
  auVar154 = sha256rnds2_sha(auVar154,auVar183,auVar98);
  auVar83._4_4_ = auVar98._12_4_;
  auVar83._0_4_ = auVar98._8_4_;
  auVar83._8_4_ = auVar98._0_4_;
  auVar83._12_4_ = auVar98._0_4_;
  auVar183 = sha256rnds2_sha(auVar183,auVar154,auVar83);
  auVar164 = sha256msg1_sha(auVar178,auVar158);
  auVar173._0_4_ = auVar146._4_4_ + auVar164._0_4_;
  auVar173._4_4_ = auVar146._8_4_ + auVar164._4_4_;
  auVar173._8_4_ = auVar146._12_4_ + auVar164._8_4_;
  auVar173._12_4_ = auVar104._0_4_ + auVar164._12_4_;
  auVar168._0_4_ = auVar147._4_4_ + auVar157._0_4_;
  auVar168._4_4_ = auVar147._8_4_ + auVar157._4_4_;
  auVar168._8_4_ = auVar147._12_4_ + auVar157._8_4_;
  auVar168._12_4_ = auVar163._0_4_ + auVar157._12_4_;
  auVar157 = sha256msg2_sha(auVar168,auVar163);
  auVar84._0_4_ = auVar163._0_4_ + 0x391c0cb3;
  auVar84._4_4_ = auVar163._4_4_ + 0x4ed8aa4a;
  auVar84._8_4_ = auVar163._8_4_ + 0x5b9cca4f;
  auVar84._12_4_ = auVar163._12_4_ + 0x682e6ff3;
  auVar153 = sha256rnds2_sha(auVar153,auVar170,auVar84);
  auVar85._4_4_ = auVar84._12_4_;
  auVar85._0_4_ = auVar84._8_4_;
  auVar85._8_4_ = auVar84._0_4_;
  auVar85._12_4_ = auVar84._0_4_;
  auVar170 = sha256rnds2_sha(auVar170,auVar153,auVar85);
  auVar164 = sha256msg2_sha(auVar173,auVar104);
  auVar126._0_4_ = auVar164._0_4_ + 0x391c0cb3;
  auVar126._4_4_ = auVar164._4_4_ + 0x4ed8aa4a;
  auVar126._8_4_ = auVar164._8_4_ + 0x5b9cca4f;
  auVar126._12_4_ = auVar164._12_4_ + 0x682e6ff3;
  auVar154 = sha256rnds2_sha(auVar154,auVar183,auVar126);
  auVar147 = sha256msg1_sha(auVar158,auVar146);
  auVar146 = sha256msg1_sha(auVar146,auVar104);
  auVar86._4_4_ = auVar126._12_4_;
  auVar86._0_4_ = auVar126._8_4_;
  auVar86._8_4_ = auVar126._0_4_;
  auVar86._12_4_ = auVar126._0_4_;
  auVar158 = sha256rnds2_sha(auVar183,auVar154,auVar86);
  auVar127._0_4_ = auVar104._4_4_ + auVar147._0_4_;
  auVar127._4_4_ = auVar104._8_4_ + auVar147._4_4_;
  auVar127._8_4_ = auVar104._12_4_ + auVar147._8_4_;
  auVar127._12_4_ = auVar164._0_4_ + auVar147._12_4_;
  auVar99._0_4_ = auVar163._4_4_ + auVar152._0_4_;
  auVar99._4_4_ = auVar163._8_4_ + auVar152._4_4_;
  auVar99._8_4_ = auVar163._12_4_ + auVar152._8_4_;
  auVar99._12_4_ = auVar157._0_4_ + auVar152._12_4_;
  auVar147 = sha256msg2_sha(auVar99,auVar157);
  auVar87._0_4_ = auVar157._0_4_ + 0x748f82ee;
  auVar87._4_4_ = auVar157._4_4_ + 0x78a5636f;
  auVar87._8_4_ = auVar157._8_4_ + -0x7b3787ec;
  auVar87._12_4_ = auVar157._12_4_ + -0x7338fdf8;
  auVar163 = sha256rnds2_sha(auVar153,auVar170,auVar87);
  auVar104 = sha256msg2_sha(auVar127,auVar164);
  auVar88._4_4_ = auVar87._12_4_;
  auVar88._0_4_ = auVar87._8_4_;
  auVar88._8_4_ = auVar87._0_4_;
  auVar88._12_4_ = auVar87._0_4_;
  auVar152 = sha256rnds2_sha(auVar170,auVar163,auVar88);
  auVar111._0_4_ = auVar104._0_4_ + 0x748f82ee;
  auVar111._4_4_ = auVar104._4_4_ + 0x78a5636f;
  auVar111._8_4_ = auVar104._8_4_ + -0x7b3787ec;
  auVar111._12_4_ = auVar104._12_4_ + -0x7338fdf8;
  auVar153 = sha256rnds2_sha(auVar154,auVar158,auVar111);
  auVar89._4_4_ = auVar111._12_4_;
  auVar89._0_4_ = auVar111._8_4_;
  auVar89._8_4_ = auVar111._0_4_;
  auVar89._12_4_ = auVar111._0_4_;
  auVar154 = sha256rnds2_sha(auVar158,auVar153,auVar89);
  auVar112._0_4_ = auVar164._4_4_ + auVar146._0_4_;
  auVar112._4_4_ = auVar164._8_4_ + auVar146._4_4_;
  auVar112._8_4_ = auVar164._12_4_ + auVar146._8_4_;
  auVar112._12_4_ = auVar104._0_4_ + auVar146._12_4_;
  auVar104 = sha256msg2_sha(auVar112,auVar104);
  auVar100._0_4_ = auVar147._0_4_ + -0x6f410006;
  auVar100._4_4_ = auVar147._4_4_ + -0x5baf9315;
  auVar100._8_4_ = auVar147._8_4_ + -0x41065c09;
  auVar100._12_4_ = auVar147._12_4_ + -0x398e870e;
  auVar147 = sha256rnds2_sha(auVar163,auVar152,auVar100);
  auVar90._4_4_ = auVar100._12_4_;
  auVar90._0_4_ = auVar100._8_4_;
  auVar90._8_4_ = auVar100._0_4_;
  auVar90._12_4_ = auVar100._0_4_;
  auVar163 = sha256rnds2_sha(auVar152,auVar147,auVar90);
  auVar113._0_4_ = auVar104._0_4_ + -0x6f410006;
  auVar113._4_4_ = auVar104._4_4_ + -0x5baf9315;
  auVar113._8_4_ = auVar104._8_4_ + -0x41065c09;
  auVar113._12_4_ = auVar104._12_4_ + -0x398e870e;
  auVar104 = sha256rnds2_sha(auVar153,auVar154,auVar113);
  auVar91._4_4_ = auVar113._12_4_;
  auVar91._0_4_ = auVar113._8_4_;
  auVar91._8_4_ = auVar113._0_4_;
  auVar91._12_4_ = auVar113._0_4_;
  auVar153 = sha256rnds2_sha(auVar154,auVar104,auVar91);
  auVar114._0_4_ = auVar163._12_4_ + 0x6a09e667;
  auVar114._4_4_ = auVar163._8_4_ + -0x4498517b;
  auVar114._8_4_ = auVar163._4_4_ + 0x510e527f;
  auVar114._12_4_ = auVar163._0_4_ + -0x64fa9774;
  auVar132._0_4_ = auVar147._4_4_ + 0x1f83d9ab;
  auVar132._4_4_ = auVar147._0_4_ + 0x5be0cd19;
  auVar132._8_4_ = auVar147._12_4_ + 0x3c6ef372;
  auVar132._12_4_ = auVar147._8_4_ + -0x5ab00ac6;
  auVar92._0_4_ = auVar153._12_4_ + 0x6a09e667;
  auVar92._4_4_ = auVar153._8_4_ + -0x4498517b;
  auVar92._8_4_ = auVar153._4_4_ + 0x510e527f;
  auVar92._12_4_ = auVar153._0_4_ + -0x64fa9774;
  auVar101._0_4_ = auVar104._4_4_ + 0x1f83d9ab;
  auVar101._4_4_ = auVar104._0_4_ + 0x5be0cd19;
  auVar101._8_4_ = auVar104._12_4_ + 0x3c6ef372;
  auVar101._12_4_ = auVar104._8_4_ + -0x5ab00ac6;
  auVar104 = ZEXT816(0x405060700010203);
  auVar147 = pshufb(auVar114,auVar104);
  auVar153 = ZEXT816(0xc0d0e0f08090a0b);
  auVar163 = pshufb(auVar132,auVar153);
  *(long *)out = auVar147._0_8_;
  *(long *)(out + 8) = auVar163._0_8_;
  auVar147 = pshufb(auVar114,auVar153);
  auVar163 = pshufb(auVar132,auVar104);
  *(long *)(out + 0x10) = auVar147._0_8_;
  *(long *)(out + 0x18) = auVar163._0_8_;
  auVar147 = pshufb(auVar92,auVar104);
  auVar163 = pshufb(auVar101,auVar153);
  *(long *)(out + 0x20) = auVar147._0_8_;
  *(long *)(out + 0x28) = auVar163._0_8_;
  auVar147 = pshufb(auVar92,auVar153);
  auVar104 = pshufb(auVar101,auVar104);
  *(long *)(out + 0x30) = auVar147._0_8_;
  *(long *)(out + 0x38) = auVar104._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Transform_2way(unsigned char* out, const unsigned char* in)
{
    __m128i am0, am1, am2, am3, as0, as1, aso0, aso1;
    __m128i bm0, bm1, bm2, bm3, bs0, bs1, bso0, bso1;

    /* Transform 1 */
    bs0 = as0 = _mm_load_si128((const __m128i*)INIT0);
    bs1 = as1 = _mm_load_si128((const __m128i*)INIT1);
    am0 = Load(in);
    bm0 = Load(in + 64);
    QuadRound(as0, as1, am0, 0xe9b5dba5b5c0fbcfull, 0x71374491428a2f98ull);
    QuadRound(bs0, bs1, bm0, 0xe9b5dba5b5c0fbcfull, 0x71374491428a2f98ull);
    am1 = Load(in + 16);
    bm1 = Load(in + 80);
    QuadRound(as0, as1, am1, 0xab1c5ed5923f82a4ull, 0x59f111f13956c25bull);
    QuadRound(bs0, bs1, bm1, 0xab1c5ed5923f82a4ull, 0x59f111f13956c25bull);
    ShiftMessageA(am0, am1);
    ShiftMessageA(bm0, bm1);
    am2 = Load(in + 32);
    bm2 = Load(in + 96);
    QuadRound(as0, as1, am2, 0x550c7dc3243185beull, 0x12835b01d807aa98ull);
    QuadRound(bs0, bs1, bm2, 0x550c7dc3243185beull, 0x12835b01d807aa98ull);
    ShiftMessageA(am1, am2);
    ShiftMessageA(bm1, bm2);
    am3 = Load(in + 48);
    bm3 = Load(in + 112);
    QuadRound(as0, as1, am3, 0xc19bf1749bdc06a7ull, 0x80deb1fe72be5d74ull);
    QuadRound(bs0, bs1, bm3, 0xc19bf1749bdc06a7ull, 0x80deb1fe72be5d74ull);
    ShiftMessageB(am2, am3, am0);
    ShiftMessageB(bm2, bm3, bm0);
    QuadRound(as0, as1, am0, 0x240ca1cc0fc19dc6ull, 0xefbe4786E49b69c1ull);
    QuadRound(bs0, bs1, bm0, 0x240ca1cc0fc19dc6ull, 0xefbe4786E49b69c1ull);
    ShiftMessageB(am3, am0, am1);
    ShiftMessageB(bm3, bm0, bm1);
    QuadRound(as0, as1, am1, 0x76f988da5cb0a9dcull, 0x4a7484aa2de92c6full);
    QuadRound(bs0, bs1, bm1, 0x76f988da5cb0a9dcull, 0x4a7484aa2de92c6full);
    ShiftMessageB(am0, am1, am2);
    ShiftMessageB(bm0, bm1, bm2);
    QuadRound(as0, as1, am2, 0xbf597fc7b00327c8ull, 0xa831c66d983e5152ull);
    QuadRound(bs0, bs1, bm2, 0xbf597fc7b00327c8ull, 0xa831c66d983e5152ull);
    ShiftMessageB(am1, am2, am3);
    ShiftMessageB(bm1, bm2, bm3);
    QuadRound(as0, as1, am3, 0x1429296706ca6351ull, 0xd5a79147c6e00bf3ull);
    QuadRound(bs0, bs1, bm3, 0x1429296706ca6351ull, 0xd5a79147c6e00bf3ull);
    ShiftMessageB(am2, am3, am0);
    ShiftMessageB(bm2, bm3, bm0);
    QuadRound(as0, as1, am0, 0x53380d134d2c6dfcull, 0x2e1b213827b70a85ull);
    QuadRound(bs0, bs1, bm0, 0x53380d134d2c6dfcull, 0x2e1b213827b70a85ull);
    ShiftMessageB(am3, am0, am1);
    ShiftMessageB(bm3, bm0, bm1);
    QuadRound(as0, as1, am1, 0x92722c8581c2c92eull, 0x766a0abb650a7354ull);
    QuadRound(bs0, bs1, bm1, 0x92722c8581c2c92eull, 0x766a0abb650a7354ull);
    ShiftMessageB(am0, am1, am2);
    ShiftMessageB(bm0, bm1, bm2);
    QuadRound(as0, as1, am2, 0xc76c51A3c24b8b70ull, 0xa81a664ba2bfe8a1ull);
    QuadRound(bs0, bs1, bm2, 0xc76c51A3c24b8b70ull, 0xa81a664ba2bfe8a1ull);
    ShiftMessageB(am1, am2, am3);
    ShiftMessageB(bm1, bm2, bm3);
    QuadRound(as0, as1, am3, 0x106aa070f40e3585ull, 0xd6990624d192e819ull);
    QuadRound(bs0, bs1, bm3, 0x106aa070f40e3585ull, 0xd6990624d192e819ull);
    ShiftMessageB(am2, am3, am0);
    ShiftMessageB(bm2, bm3, bm0);
    QuadRound(as0, as1, am0, 0x34b0bcb52748774cull, 0x1e376c0819a4c116ull);
    QuadRound(bs0, bs1, bm0, 0x34b0bcb52748774cull, 0x1e376c0819a4c116ull);
    ShiftMessageB(am3, am0, am1);
    ShiftMessageB(bm3, bm0, bm1);
    QuadRound(as0, as1, am1, 0x682e6ff35b9cca4full, 0x4ed8aa4a391c0cb3ull);
    QuadRound(bs0, bs1, bm1, 0x682e6ff35b9cca4full, 0x4ed8aa4a391c0cb3ull);
    ShiftMessageC(am0, am1, am2);
    ShiftMessageC(bm0, bm1, bm2);
    QuadRound(as0, as1, am2, 0x8cc7020884c87814ull, 0x78a5636f748f82eeull);
    QuadRound(bs0, bs1, bm2, 0x8cc7020884c87814ull, 0x78a5636f748f82eeull);
    ShiftMessageC(am1, am2, am3);
    ShiftMessageC(bm1, bm2, bm3);
    QuadRound(as0, as1, am3, 0xc67178f2bef9A3f7ull, 0xa4506ceb90befffaull);
    QuadRound(bs0, bs1, bm3, 0xc67178f2bef9A3f7ull, 0xa4506ceb90befffaull);
    as0 = _mm_add_epi32(as0, _mm_load_si128((const __m128i*)INIT0));
    bs0 = _mm_add_epi32(bs0, _mm_load_si128((const __m128i*)INIT0));
    as1 = _mm_add_epi32(as1, _mm_load_si128((const __m128i*)INIT1));
    bs1 = _mm_add_epi32(bs1, _mm_load_si128((const __m128i*)INIT1));

    /* Transform 2 */
    aso0 = as0;
    bso0 = bs0;
    aso1 = as1;
    bso1 = bs1;
    QuadRound(as0, as1, 0xe9b5dba5b5c0fbcfull, 0x71374491c28a2f98ull);
    QuadRound(bs0, bs1, 0xe9b5dba5b5c0fbcfull, 0x71374491c28a2f98ull);
    QuadRound(as0, as1, 0xab1c5ed5923f82a4ull, 0x59f111f13956c25bull);
    QuadRound(bs0, bs1, 0xab1c5ed5923f82a4ull, 0x59f111f13956c25bull);
    QuadRound(as0, as1, 0x550c7dc3243185beull, 0x12835b01d807aa98ull);
    QuadRound(bs0, bs1, 0x550c7dc3243185beull, 0x12835b01d807aa98ull);
    QuadRound(as0, as1, 0xc19bf3749bdc06a7ull, 0x80deb1fe72be5d74ull);
    QuadRound(bs0, bs1, 0xc19bf3749bdc06a7ull, 0x80deb1fe72be5d74ull);
    QuadRound(as0, as1, 0x240cf2540fe1edc6ull, 0xf0fe4786649b69c1ull);
    QuadRound(bs0, bs1, 0x240cf2540fe1edc6ull, 0xf0fe4786649b69c1ull);
    QuadRound(as0, as1, 0x16f988fa61b9411eull, 0x6cc984be4fe9346full);
    QuadRound(bs0, bs1, 0x16f988fa61b9411eull, 0x6cc984be4fe9346full);
    QuadRound(as0, as1, 0xb9d99ec7b019fc65ull, 0xa88e5a6df2c65152ull);
    QuadRound(bs0, bs1, 0xb9d99ec7b019fc65ull, 0xa88e5a6df2c65152ull);
    QuadRound(as0, as1, 0xc7353eb0fdb1232bull, 0xe70eeaa09a1231c3ull);
    QuadRound(bs0, bs1, 0xc7353eb0fdb1232bull, 0xe70eeaa09a1231c3ull);
    QuadRound(as0, as1, 0xdc1eeefd5a0f118full, 0xcb976d5f3069bad5ull);
    QuadRound(bs0, bs1, 0xdc1eeefd5a0f118full, 0xcb976d5f3069bad5ull);
    QuadRound(as0, as1, 0xe15d5b1658f4ca9dull, 0xde0b7a040a35b689ull);
    QuadRound(bs0, bs1, 0xe15d5b1658f4ca9dull, 0xde0b7a040a35b689ull);
    QuadRound(as0, as1, 0x6fab9537a507ea32ull, 0x37088980007f3e86ull);
    QuadRound(bs0, bs1, 0x6fab9537a507ea32ull, 0x37088980007f3e86ull);
    QuadRound(as0, as1, 0xc0bbbe37cdaa3b6dull, 0x0d8cd6f117406110ull);
    QuadRound(bs0, bs1, 0xc0bbbe37cdaa3b6dull, 0x0d8cd6f117406110ull);
    QuadRound(as0, as1, 0x6fd15ca70b02e931ull, 0xdb48a36383613bdaull);
    QuadRound(bs0, bs1, 0x6fd15ca70b02e931ull, 0xdb48a36383613bdaull);
    QuadRound(as0, as1, 0x6d4378906ed41a95ull, 0x31338431521afacaull);
    QuadRound(bs0, bs1, 0x6d4378906ed41a95ull, 0x31338431521afacaull);
    QuadRound(as0, as1, 0x532fb63cb5c9a0e6ull, 0x9eccabbdc39c91f2ull);
    QuadRound(bs0, bs1, 0x532fb63cb5c9a0e6ull, 0x9eccabbdc39c91f2ull);
    QuadRound(as0, as1, 0x4c191d76a4954b68ull, 0x07237ea3d2c741c6ull);
    QuadRound(bs0, bs1, 0x4c191d76a4954b68ull, 0x07237ea3d2c741c6ull);
    as0 = _mm_add_epi32(as0, aso0);
    bs0 = _mm_add_epi32(bs0, bso0);
    as1 = _mm_add_epi32(as1, aso1);
    bs1 = _mm_add_epi32(bs1, bso1);

    /* Extract hash */
    Unshuffle(as0, as1);
    Unshuffle(bs0, bs1);
    am0 = as0;
    bm0 = bs0;
    am1 = as1;
    bm1 = bs1;

    /* Transform 3 */
    bs0 = as0 = _mm_load_si128((const __m128i*)INIT0);
    bs1 = as1 = _mm_load_si128((const __m128i*)INIT1);
    QuadRound(as0, as1, am0, 0xe9b5dba5B5c0fbcfull, 0x71374491428a2f98ull);
    QuadRound(bs0, bs1, bm0, 0xe9b5dba5B5c0fbcfull, 0x71374491428a2f98ull);
    QuadRound(as0, as1, am1, 0xab1c5ed5923f82a4ull, 0x59f111f13956c25bull);
    QuadRound(bs0, bs1, bm1, 0xab1c5ed5923f82a4ull, 0x59f111f13956c25bull);
    ShiftMessageA(am0, am1);
    ShiftMessageA(bm0, bm1);
    bm2 = am2 = _mm_set_epi64x(0x0ull, 0x80000000ull);
    QuadRound(as0, as1, 0x550c7dc3243185beull, 0x12835b015807aa98ull);
    QuadRound(bs0, bs1, 0x550c7dc3243185beull, 0x12835b015807aa98ull);
    ShiftMessageA(am1, am2);
    ShiftMessageA(bm1, bm2);
    bm3 = am3 = _mm_set_epi64x(0x10000000000ull, 0x0ull);
    QuadRound(as0, as1, 0xc19bf2749bdc06a7ull, 0x80deb1fe72be5d74ull);
    QuadRound(bs0, bs1, 0xc19bf2749bdc06a7ull, 0x80deb1fe72be5d74ull);
    ShiftMessageB(am2, am3, am0);
    ShiftMessageB(bm2, bm3, bm0);
    QuadRound(as0, as1, am0, 0x240ca1cc0fc19dc6ull, 0xefbe4786e49b69c1ull);
    QuadRound(bs0, bs1, bm0, 0x240ca1cc0fc19dc6ull, 0xefbe4786e49b69c1ull);
    ShiftMessageB(am3, am0, am1);
    ShiftMessageB(bm3, bm0, bm1);
    QuadRound(as0, as1, am1, 0x76f988da5cb0a9dcull, 0x4a7484aa2de92c6full);
    QuadRound(bs0, bs1, bm1, 0x76f988da5cb0a9dcull, 0x4a7484aa2de92c6full);
    ShiftMessageB(am0, am1, am2);
    ShiftMessageB(bm0, bm1, bm2);
    QuadRound(as0, as1, am2, 0xbf597fc7b00327c8ull, 0xa831c66d983e5152ull);
    QuadRound(bs0, bs1, bm2, 0xbf597fc7b00327c8ull, 0xa831c66d983e5152ull);
    ShiftMessageB(am1, am2, am3);
    ShiftMessageB(bm1, bm2, bm3);
    QuadRound(as0, as1, am3, 0x1429296706ca6351ull, 0xd5a79147c6e00bf3ull);
    QuadRound(bs0, bs1, bm3, 0x1429296706ca6351ull, 0xd5a79147c6e00bf3ull);
    ShiftMessageB(am2, am3, am0);
    ShiftMessageB(bm2, bm3, bm0);
    QuadRound(as0, as1, am0, 0x53380d134d2c6dfcull, 0x2e1b213827b70a85ull);
    QuadRound(bs0, bs1, bm0, 0x53380d134d2c6dfcull, 0x2e1b213827b70a85ull);
    ShiftMessageB(am3, am0, am1);
    ShiftMessageB(bm3, bm0, bm1);
    QuadRound(as0, as1, am1, 0x92722c8581c2c92eull, 0x766a0abb650a7354ull);
    QuadRound(bs0, bs1, bm1, 0x92722c8581c2c92eull, 0x766a0abb650a7354ull);
    ShiftMessageB(am0, am1, am2);
    ShiftMessageB(bm0, bm1, bm2);
    QuadRound(as0, as1, am2, 0xc76c51a3c24b8b70ull, 0xa81a664ba2bfe8A1ull);
    QuadRound(bs0, bs1, bm2, 0xc76c51a3c24b8b70ull, 0xa81a664ba2bfe8A1ull);
    ShiftMessageB(am1, am2, am3);
    ShiftMessageB(bm1, bm2, bm3);
    QuadRound(as0, as1, am3, 0x106aa070f40e3585ull, 0xd6990624d192e819ull);
    QuadRound(bs0, bs1, bm3, 0x106aa070f40e3585ull, 0xd6990624d192e819ull);
    ShiftMessageB(am2, am3, am0);
    ShiftMessageB(bm2, bm3, bm0);
    QuadRound(as0, as1, am0, 0x34b0bcb52748774cull, 0x1e376c0819a4c116ull);
    QuadRound(bs0, bs1, bm0, 0x34b0bcb52748774cull, 0x1e376c0819a4c116ull);
    ShiftMessageB(am3, am0, am1);
    ShiftMessageB(bm3, bm0, bm1);
    QuadRound(as0, as1, am1, 0x682e6ff35b9cca4full, 0x4ed8aa4a391c0cb3ull);
    QuadRound(bs0, bs1, bm1, 0x682e6ff35b9cca4full, 0x4ed8aa4a391c0cb3ull);
    ShiftMessageC(am0, am1, am2);
    ShiftMessageC(bm0, bm1, bm2);
    QuadRound(as0, as1, am2, 0x8cc7020884c87814ull, 0x78a5636f748f82eeull);
    QuadRound(bs0, bs1, bm2, 0x8cc7020884c87814ull, 0x78a5636f748f82eeull);
    ShiftMessageC(am1, am2, am3);
    ShiftMessageC(bm1, bm2, bm3);
    QuadRound(as0, as1, am3, 0xc67178f2bef9a3f7ull, 0xa4506ceb90befffaull);
    QuadRound(bs0, bs1, bm3, 0xc67178f2bef9a3f7ull, 0xa4506ceb90befffaull);
    as0 = _mm_add_epi32(as0, _mm_load_si128((const __m128i*)INIT0));
    bs0 = _mm_add_epi32(bs0, _mm_load_si128((const __m128i*)INIT0));
    as1 = _mm_add_epi32(as1, _mm_load_si128((const __m128i*)INIT1));
    bs1 = _mm_add_epi32(bs1, _mm_load_si128((const __m128i*)INIT1));

    /* Extract hash into out */
    Unshuffle(as0, as1);
    Unshuffle(bs0, bs1);
    Save(out, as0);
    Save(out + 16, as1);
    Save(out + 32, bs0);
    Save(out + 48, bs1);
}